

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::add<wasm::Type::BasicType>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,Type option,BasicType rest)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  Type option_00;
  value_type local_38;
  Type option_local;
  FeatureSet feature_local;
  
  local_38.id = option.id;
  option_local.id._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,&local_38);
  option_00.id._4_4_ = 0;
  option_00.id._0_4_ = rest;
  pFVar1 = add<>(this,option_local.id._4_4_,option_00);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }